

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_backend.cpp
# Opt level: O0

locale __thiscall
booster::locale::impl_posix::posix_localization_backend::install
          (posix_localization_backend *this,locale *base,locale_category_type category,
          character_facet_type type)

{
  element_type *pp_Var1;
  char *pcVar2;
  back_insert_iterator<std::vector<booster::locale::gnu_gettext::messages_info::domain,_std::allocator<booster::locale::gnu_gettext::messages_info::domain>_>_>
  this_00;
  back_insert_iterator<std::vector<booster::locale::gnu_gettext::messages_info::domain,_std::allocator<booster::locale::gnu_gettext::messages_info::domain>_>_>
  bVar3;
  int in_ECX;
  locale *in_RDX;
  long in_RSI;
  _Impl *in_RDI;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  int in_R8D;
  locale_data inf_1;
  messages_info minf;
  locale_data inf;
  string *in_stack_fffffffffffffc88;
  messages_info *in_stack_fffffffffffffc90;
  messages_info *in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcac;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffcb0;
  locale *in_stack_fffffffffffffcb8;
  locale_data *in_stack_fffffffffffffcd0;
  messages_info *in_stack_fffffffffffffce0;
  allocator *paVar4;
  undefined8 in_stack_fffffffffffffcf8;
  character_facet_type type_00;
  shared_ptr<__locale_struct_*> *in_stack_fffffffffffffd00;
  shared_ptr<__locale_struct_*> *lc;
  locale *in_stack_fffffffffffffd08;
  undefined8 in_stack_fffffffffffffd18;
  character_facet_type type_01;
  posix_localization_backend *in_stack_fffffffffffffd20;
  _Impl *this_01;
  string local_298 [32];
  string local_278 [32];
  string local_258 [4];
  character_facet_type in_stack_fffffffffffffdac;
  shared_ptr<__locale_struct_*> *in_stack_fffffffffffffdb0;
  locale *in_stack_fffffffffffffdb8;
  string local_238 [40];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [287];
  allocator local_91;
  string local_90 [48];
  shared_ptr<__locale_struct_*> local_60 [4];
  int local_20;
  int local_1c;
  locale *local_18;
  
  type_01 = (character_facet_type)((ulong)in_stack_fffffffffffffd18 >> 0x20);
  type_00 = (character_facet_type)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
  this_01 = in_RDI;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  prepare_data(in_stack_fffffffffffffd20);
  if (local_1c == 1) {
    std::shared_ptr<__locale_struct_*>::shared_ptr
              ((shared_ptr<__locale_struct_*> *)in_stack_fffffffffffffc90,
               (shared_ptr<__locale_struct_*> *)in_stack_fffffffffffffc88);
    create_convert(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
    std::shared_ptr<__locale_struct_*>::~shared_ptr((shared_ptr<__locale_struct_*> *)0x29a458);
  }
  else if (local_1c == 2) {
    std::shared_ptr<__locale_struct_*>::shared_ptr
              ((shared_ptr<__locale_struct_*> *)in_stack_fffffffffffffc90,
               (shared_ptr<__locale_struct_*> *)in_stack_fffffffffffffc88);
    create_collate((locale *)in_RDI,(shared_ptr<__locale_struct_*> *)in_stack_fffffffffffffd20,
                   type_01);
    std::shared_ptr<__locale_struct_*>::~shared_ptr((shared_ptr<__locale_struct_*> *)0x29a4e7);
  }
  else if (local_1c == 4) {
    lc = local_60;
    std::shared_ptr<__locale_struct_*>::shared_ptr
              ((shared_ptr<__locale_struct_*> *)in_stack_fffffffffffffc90,
               (shared_ptr<__locale_struct_*> *)in_stack_fffffffffffffc88);
    create_formatting(in_stack_fffffffffffffd08,lc,(character_facet_type)((ulong)local_18 >> 0x20));
    std::shared_ptr<__locale_struct_*>::~shared_ptr((shared_ptr<__locale_struct_*> *)0x29a56a);
  }
  else if (local_1c == 8) {
    std::shared_ptr<__locale_struct_*>::shared_ptr
              ((shared_ptr<__locale_struct_*> *)in_stack_fffffffffffffc90,
               (shared_ptr<__locale_struct_*> *)in_stack_fffffffffffffc88);
    create_parsing(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,type_00);
    std::shared_ptr<__locale_struct_*>::~shared_ptr((shared_ptr<__locale_struct_*> *)0x29a5ed);
  }
  else if (local_1c == 0x10) {
    gnu_gettext::messages_info::messages_info(in_stack_fffffffffffffce0);
    util::locale_data::locale_data(in_stack_fffffffffffffcd0);
    util::locale_data::parse((locale_data *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    std::__cxx11::string::operator=(local_210,local_298);
    std::__cxx11::string::operator=(local_1f0,local_278);
    std::__cxx11::string::operator=(local_1d0,local_258);
    std::__cxx11::string::operator=(local_1b0,local_238);
    __first._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 0x20);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffc88);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_stack_fffffffffffffc88);
    this_00 = std::
              back_inserter<std::vector<booster::locale::gnu_gettext::messages_info::domain,std::allocator<booster::locale::gnu_gettext::messages_info::domain>>>
                        ((vector<booster::locale::gnu_gettext::messages_info::domain,_std::allocator<booster::locale::gnu_gettext::messages_info::domain>_>
                          *)in_stack_fffffffffffffc88);
    bVar3.container._4_4_ = in_stack_fffffffffffffcac;
    bVar3.container._0_4_ = in_stack_fffffffffffffca8;
    bVar3 = std::
            copy<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<booster::locale::gnu_gettext::messages_info::domain,std::allocator<booster::locale::gnu_gettext::messages_info::domain>>>>
                      (__first,in_stack_fffffffffffffcb0,bVar3);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_01,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_RDI);
    if (local_20 == 1) {
      gnu_gettext::create_messages_facet<char>(in_stack_fffffffffffffca0);
      std::locale::locale<booster::locale::message_format<char>>
                ((locale *)this_00.container,(locale *)__first._M_current,
                 (message_format<char> *)bVar3.container);
    }
    else if (local_20 == 2) {
      in_stack_fffffffffffffc90 =
           (messages_info *)gnu_gettext::create_messages_facet<wchar_t>(in_stack_fffffffffffffca0);
      std::locale::locale<booster::locale::message_format<wchar_t>>
                ((locale *)this_00.container,(locale *)__first._M_current,
                 (message_format<wchar_t> *)bVar3.container);
    }
    else {
      std::locale::locale((locale *)in_RDI,local_18);
    }
    util::locale_data::~locale_data((locale_data *)in_stack_fffffffffffffc90);
    gnu_gettext::messages_info::~messages_info(in_stack_fffffffffffffc90);
  }
  else if (local_1c == 0x20) {
    pp_Var1 = std::__shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)in_stack_fffffffffffffc90);
    pcVar2 = nl_langinfo_l(0xe,(__locale_t)*pp_Var1);
    paVar4 = &local_91;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,pcVar2,paVar4);
    create_codecvt((locale *)in_RDI,(string *)in_stack_fffffffffffffd20,type_01);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
  }
  else if (local_1c == 0x10000) {
    util::locale_data::locale_data(in_stack_fffffffffffffcd0);
    util::locale_data::parse((locale_data *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    util::install_gregorian_calendar(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0._M_current)
    ;
    util::locale_data::~locale_data((locale_data *)in_stack_fffffffffffffc90);
  }
  else if (local_1c == 0x20000) {
    util::create_info(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0._M_current);
  }
  else {
    std::locale::locale((locale *)in_RDI,local_18);
  }
  return (locale)this_01;
}

Assistant:

virtual std::locale install(std::locale const &base,
                                    locale_category_type category,
                                    character_facet_type type = nochar_facet)
        {
            prepare_data();

            switch(category) {
            case convert_facet:
                return create_convert(base,lc_,type);
            case collation_facet:
                return create_collate(base,lc_,type);
            case formatting_facet:
                return create_formatting(base,lc_,type);
            case parsing_facet:
                return create_parsing(base,lc_,type);
            case codepage_facet:
                return create_codecvt(base,nl_langinfo_l(CODESET,*lc_),type);
            case calendar_facet:
                {
                    util::locale_data inf;
                    inf.parse(real_id_);
                    return util::install_gregorian_calendar(base,inf.country);
                }
            case message_facet:
                {
                    gnu_gettext::messages_info minf;
                    util::locale_data inf;
                    inf.parse(real_id_);
                    minf.language = inf.language;
                    minf.country = inf.country;
                    minf.variant = inf.variant;
                    minf.encoding = inf.encoding;
                    std::copy(domains_.begin(),domains_.end(),std::back_inserter<gnu_gettext::messages_info::domains_type>(minf.domains));
                    minf.paths = paths_;
                    switch(type) {
                    case char_facet:
                        return std::locale(base,gnu_gettext::create_messages_facet<char>(minf));
                    case wchar_t_facet:
                        return std::locale(base,gnu_gettext::create_messages_facet<wchar_t>(minf));
                    #ifdef BOOSTER_HAS_CHAR16_T
                    case char16_t_facet:
                        return std::locale(base,gnu_gettext::create_messages_facet<char16_t>(minf));
                    #endif
                    #ifdef BOOSTER_HAS_CHAR32_T
                    case char32_t_facet:
                        return std::locale(base,gnu_gettext::create_messages_facet<char32_t>(minf));
                    #endif
                    default:
                        return base;
                    }
                }
            case information_facet:
                return util::create_info(base,real_id_);
            default:
                return base;
            }
        }